

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
lazyAssign<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *other)

{
  ulong nbCols;
  ulong nbRows;
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  Index innerSize;
  Index outerSize;
  undefined8 uVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  Index col;
  long lVar10;
  undefined8 *puVar11;
  Index row;
  long lVar12;
  
  nbCols = *(ulong *)(*(long *)other + 8);
  nbRows = *(ulong *)(*(long *)other + 0x10);
  bVar7 = nbCols == 0 || nbRows == 0;
  if ((bVar7) ||
     (auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     uVar6 = SUB168(auVar5 % SEXT816((long)nbCols),0),
     (long)nbRows <= SUB168(auVar5 / SEXT816((long)nbCols),0))) {
    if ((long)(nbCols | nbRows) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/PlainObjectBase.h"
                    ,0xf1,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((bVar7) ||
       (auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       uVar6 = SUB168(auVar5 % SEXT816((long)nbCols),0),
       (long)nbRows <= SUB168(auVar5 / SEXT816((long)nbCols),0))) {
      DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this,nbCols * nbRows,nbRows,nbCols);
      lVar1 = *(long *)(this + 8);
      plVar2 = *(long **)other;
      if (lVar1 == plVar2[2]) {
        lVar3 = *(long *)(this + 0x10);
        lVar4 = plVar2[1];
        if (lVar3 == lVar4) {
          if (0 < lVar3) {
            lVar8 = *(long *)this;
            lVar9 = 0;
            lVar10 = 0;
            do {
              if (0 < lVar1) {
                puVar11 = (undefined8 *)(*plVar2 + lVar9);
                lVar12 = 0;
                do {
                  *(undefined8 *)(lVar8 + lVar12 * 8) = *puVar11;
                  lVar12 = lVar12 + 1;
                  puVar11 = puVar11 + lVar4;
                } while (lVar1 != lVar12);
              }
              lVar10 = lVar10 + 1;
              lVar8 = lVar8 + lVar1 * 8;
              lVar9 = lVar9 + 8;
            } while (lVar10 != lVar3);
          }
          if ((*(long *)this != 0) && (*plVar2 == *(long *)this)) {
            __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/Transpose.h"
                          ,0x18a,
                          "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Matrix<double, -1, -1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, MightHaveTransposeAliasing = true]"
                         );
          }
          return (Matrix<double,__1,__1,_0,__1,__1> *)this;
        }
      }
      __assert_fail("rows() == other.rows() && cols() == other.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/Assign.h"
                    ,0x1f9,
                    "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, -1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>]"
                   );
    }
  }
  puVar11 = (undefined8 *)__cxa_allocate_exception(8,bVar7,uVar6);
  *puVar11 = operator_delete;
  __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }